

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O1

Vec_Wrd_t * Maj3_ManTruthTables(Maj3_Man_t *p)

{
  int iVar1;
  uint uVar2;
  word wVar3;
  int iVar4;
  Vec_Wrd_t *pVVar5;
  word *__s;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  word *pwVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  
  iVar7 = p->nWords;
  lVar16 = (long)iVar7;
  iVar1 = p->nObjs;
  lVar17 = ((long)iVar1 + 1) * lVar16;
  pVVar5 = (Vec_Wrd_t *)malloc(0x10);
  iVar4 = (int)lVar17;
  iVar6 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar6 = iVar4;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar6;
  if (iVar6 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar6 << 3);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = iVar4;
  uVar9 = 0;
  memset(__s,0,(long)iVar4 << 3);
  p->vInfo = pVVar5;
  uVar2 = p->nVars;
  uVar10 = 1 << ((byte)uVar2 & 0x1f);
  uVar8 = 0x40;
  if (0x40 < (int)uVar10) {
    uVar8 = uVar10;
  }
  if (0 < (long)(int)uVar2) {
    uVar11 = (ulong)(uint)(1 << ((byte)uVar2 - 6 & 0x1f));
    if ((int)uVar2 < 7) {
      uVar11 = 1;
    }
    uVar12 = 0;
    pwVar14 = __s;
    do {
      if (((long)(uVar12 * lVar16) < 0) || (lVar17 <= (long)(uVar12 * lVar16))) goto LAB_005a944c;
      if (uVar12 < 6) {
        if (0 < (int)uVar11) {
          wVar3 = s_Truths6[uVar12];
          uVar15 = 0;
          do {
            pwVar14[uVar15] = wVar3;
            uVar15 = uVar15 + 1;
          } while (uVar11 != uVar15);
        }
      }
      else if (0 < (int)uVar11) {
        uVar15 = 0;
        do {
          pwVar14[uVar15] = -(ulong)((1 << ((char)uVar12 - 6U & 0x1f) & (uint)uVar15) != 0);
          uVar15 = uVar15 + 1;
        } while (uVar11 != uVar15);
      }
      uVar12 = uVar12 + 1;
      pwVar14 = pwVar14 + lVar16;
    } while (uVar12 != (long)(int)uVar2);
  }
  uVar10 = iVar7 * iVar1;
  do {
    iVar7 = 0;
    if (0 < (int)uVar2) {
      uVar13 = 0;
      do {
        iVar7 = iVar7 + (uint)((uVar9 >> (uVar13 & 0x1f) & 1) != 0);
        uVar13 = uVar13 + 1;
      } while (uVar2 != uVar13);
    }
    if ((int)uVar2 / 2 < iVar7) {
      if (iVar4 <= (int)uVar10 || (int)uVar10 < 0) {
LAB_005a944c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      __s[(ulong)uVar10 + (ulong)(uVar9 >> 6)] =
           __s[(ulong)uVar10 + (ulong)(uVar9 >> 6)] | 1L << ((byte)uVar9 & 0x3f);
    }
    uVar9 = uVar9 + 1;
    if (uVar9 == uVar8) {
      return pVVar5;
    }
  } while( true );
}

Assistant:

Vec_Wrd_t * Maj3_ManTruthTables( Maj3_Man_t * p )
{
    Vec_Wrd_t * vInfo = p->vInfo = Vec_WrdStart( p->nWords * (p->nObjs + 1) ); 
    int i, nMints = Abc_MaxInt( 64, 1 << p->nVars );
    for ( i = 0; i < p->nVars; i++ )
        Abc_TtIthVar( Maj3_ManTruth(p, i), i, p->nVars );
    for ( i = 0; i < nMints; i++ )
        if ( Maj3_ManValue(i, p->nVars) )
            Abc_TtSetBit( Maj3_ManTruth(p, p->nObjs), i );
    //Dau_DsdPrintFromTruth( Maj3_ManTruth(p, p->nObjs), p->nVars );
    return vInfo;
}